

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_add_passphrase.c
# Opt level: O3

int archive_read_add_passphrase(archive *_a,char *passphrase)

{
  int iVar1;
  archive_string_conv *paVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_add_passphrase");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if ((passphrase == (char *)0x0) || (*passphrase == '\0')) {
      archive_set_error(_a,-1,"Empty passphrase is unacceptable");
      iVar3 = -0x19;
    }
    else {
      paVar2 = (archive_string_conv *)new_read_passphrase((archive_read *)_a,passphrase);
      if (paVar2 != (archive_string_conv *)0x0) {
        (_a[0xe].sconv)->next = paVar2;
        _a[0xe].sconv = (archive_string_conv *)&paVar2->from_charset;
        paVar2->from_charset = (char *)0x0;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
archive_read_add_passphrase(struct archive *_a, const char *passphrase)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_passphrase *p;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
		"archive_read_add_passphrase");

	if (passphrase == NULL || passphrase[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}

	p = new_read_passphrase(a, passphrase);
	if (p == NULL)
		return (ARCHIVE_FATAL);
	add_passphrase_to_tail(a, p);

	return (ARCHIVE_OK);
}